

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_153ab3::Db::parseFunctionParam(Db *this)

{
  bool bVar1;
  undefined1 local_68 [8];
  StringView Num_1;
  StringView local_48;
  undefined1 local_38 [8];
  StringView Num;
  Db *this_local;
  
  StringView::StringView((StringView *)&Num.Last,"fp");
  bVar1 = consumeIf(this,stack0xffffffffffffffd8);
  if (bVar1) {
    parseCVQualifiers(this);
    _local_38 = parseNumber(this,false);
    bVar1 = consumeIf(this,'_');
    if (bVar1) {
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::FunctionParam,StringView&>
                                   ((Db *)this,(StringView *)local_38);
    }
    else {
      this_local = (Db *)0x0;
    }
  }
  else {
    StringView::StringView(&local_48,"fL");
    bVar1 = consumeIf(this,local_48);
    if (bVar1) {
      join_0x00000010_0x00000000_ = parseNumber(this,false);
      bVar1 = StringView::empty((StringView *)&Num_1.Last);
      if (bVar1) {
        this_local = (Db *)0x0;
      }
      else {
        bVar1 = consumeIf(this,'p');
        if (bVar1) {
          parseCVQualifiers(this);
          _local_68 = parseNumber(this,false);
          bVar1 = consumeIf(this,'_');
          if (bVar1) {
            this_local = (Db *)(anonymous_namespace)::Db::
                               make<(anonymous_namespace)::FunctionParam,StringView&>
                                         ((Db *)this,(StringView *)local_68);
          }
          else {
            this_local = (Db *)0x0;
          }
        }
        else {
          this_local = (Db *)0x0;
        }
      }
    }
    else {
      this_local = (Db *)0x0;
    }
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseFunctionParam() {
  if (consumeIf("fp")) {
    parseCVQualifiers();
    StringView Num = parseNumber();
    if (!consumeIf('_'))
      return nullptr;
    return make<FunctionParam>(Num);
  }
  if (consumeIf("fL")) {
    if (parseNumber().empty())
      return nullptr;
    if (!consumeIf('p'))
      return nullptr;
    parseCVQualifiers();
    StringView Num = parseNumber();
    if (!consumeIf('_'))
      return nullptr;
    return make<FunctionParam>(Num);
  }
  return nullptr;
}